

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_test.cpp
# Opt level: O2

void __thiscall sign_verifycase::_impl<picnic_params_t>(sign_verifycase *this,anon_enum_32 *param)

{
  result_type rVar1;
  int iVar2;
  anon_enum_32 aVar3;
  ulong uVar4;
  unit_test_log_t *this_00;
  random_device *this_01;
  pointer *ppuVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_02;
  shared_count *psVar6;
  long lVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  assertion_result local_1640;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  local_1628;
  context_frame context_frame_250;
  size_t max_signature_size;
  char *local_1608;
  char *local_1600;
  size_t siglen;
  lazy_ostream local_15f0;
  undefined1 *local_15e0;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  *local_15d8;
  picnic_publickey_t public_key;
  array<unsigned_char,_32UL> m;
  const_string local_1568;
  const_string local_1558;
  const_string local_1548;
  const_string local_1538;
  const_string local_1528;
  const_string local_1518;
  const_string local_1508;
  const_string local_14f8;
  const_string local_14e8;
  const_string local_14d8;
  const_string local_14c8;
  const_string local_14b8;
  const_string local_14a8;
  const_string local_1498;
  const_string local_1488;
  const_string local_1478;
  const_string local_1468;
  const_string local_1458;
  const_string local_1448;
  const_string local_1438;
  const_string local_1428;
  const_string local_1418;
  const_string local_1408;
  const_string local_13f8;
  const_string local_13e8;
  const_string local_13d8;
  const_string local_13c8;
  picnic_privatekey_t private_key;
  
  public_key.data[8] = '\0';
  public_key.data._0_8_ = &PTR__lazy_ostream_00180480;
  public_key.data._16_8_ = boost::unit_test::lazy_ostream::inst;
  public_key.data._24_8_ = anon_var_dwarf_893fa;
  m._M_elems._0_8_ = picnic_get_param_name(*param);
  private_key.data._16_8_ = &public_key;
  private_key.data[8] = '\0';
  private_key.data._0_8_ = &PTR__lazy_ostream_00182790;
  private_key.data._24_8_ = &m;
  context_frame_250.m_frame_id =
       boost::unit_test::framework::add_context((lazy_ostream *)&private_key,true);
  this_00 = (unit_test_log_t *)(ulong)*param;
  max_signature_size = picnic_signature_size();
  local_13c8.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_13d8.m_begin = "";
  local_13c8.m_end = "";
  local_13d8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(this_00,&local_13c8,0x1b,&local_13d8);
  local_15f0._vptr_lazy_ostream = (_func_int **)&max_signature_size;
  boost::test_tools::assertion::value_expr<const_unsigned_long_&>::evaluate
            ((assertion_result *)&public_key,(value_expr<const_unsigned_long_&> *)&local_15f0,false)
  ;
  m._M_elems._0_8_ = (long)"siglen <= max_signature_size" + 10;
  private_key.data[8] = '\0';
  m._M_elems._8_8_ = (long)"siglen <= max_signature_size" + 0x1c;
  private_key.data._0_8_ = &PTR__lazy_ostream_001827d0;
  private_key.data._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_13e8.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_13e8.m_end = "";
  private_key.data._24_8_ = &m;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&public_key,(lazy_ostream *)&private_key,&local_13e8,0x1b,CHECK,
             CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count((shared_count *)(public_key.data + 0x10));
  public_key.data[0] = '\0';
  public_key.data[1] = '\0';
  public_key.data[2] = '\0';
  public_key.data[3] = '\0';
  public_key.data[4] = 0xff;
  public_key.data[5] = '\0';
  public_key.data[6] = '\0';
  public_key.data[7] = '\0';
  std::random_device::random_device((random_device *)&private_key);
  uVar4 = std::random_device::_M_getval();
  iVar2 = (int)((uVar4 & 0xffffffff) % 0x7fffffff);
  local_15f0._vptr_lazy_ostream = (_func_int **)(ulong)(iVar2 + (uint)(iVar2 == 0));
  for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 1) {
    rVar1 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)&public_key,
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       &local_15f0);
    m._M_elems[lVar7] = (uchar)rVar1;
  }
  this_01 = (random_device *)&private_key;
  std::random_device::~random_device(this_01);
  local_13f8.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_1408.m_begin = "";
  local_13f8.m_end = "";
  local_1408.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_01,&local_13f8,0x23,&local_1408);
  iVar2 = picnic_keygen(*param,&public_key,&private_key);
  local_1628.m_lhs.m_value._0_1_ = iVar2 == 0;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)&sig,(value_expr<bool> *)&local_1628,false);
  local_15d8 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
                *)&local_1640;
  local_1640._0_8_ = "!picnic_keygen(param, &public_key, &private_key)";
  local_15f0.m_empty = false;
  local_1418.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_1418.m_end = "";
  local_1640.m_message.px = (element_type *)0x15b6e3;
  local_15f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001827d0;
  local_15e0 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sig,&local_15f0,&local_1418,0x23,CHECK,CHECK_BUILT_ASSERTION,0);
  ppuVar5 = &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  boost::detail::shared_count::~shared_count((shared_count *)ppuVar5);
  local_1428.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_1438.m_begin = "";
  local_1428.m_end = "";
  local_1438.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)ppuVar5,&local_1428,0x26,&local_1438);
  aVar3 = picnic_get_public_key_param(&public_key);
  local_1640.m_message.px = (element_type *)param;
  local_1640._0_4_ = aVar3;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<picnic_params_t>,_const_picnic_params_t_&,_boost::test_tools::assertion::op::EQ<picnic_params_t,_picnic_params_t,_void>_>
  ::evaluate((assertion_result *)&sig,
             (binary_expr<boost::test_tools::assertion::value_expr<picnic_params_t>,_const_picnic_params_t_&,_boost::test_tools::assertion::op::EQ<picnic_params_t,_picnic_params_t,_void>_>
              *)&local_1640,false);
  local_1628.m_lhs.m_value = (unsigned_long *)0x15b6e4;
  local_15f0.m_empty = false;
  local_1448.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_1448.m_end = "";
  local_1628.m_rhs = (unsigned_long *)0x15b715;
  local_15f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001827d0;
  local_15e0 = boost::unit_test::lazy_ostream::inst;
  local_15d8 = &local_1628;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sig,&local_15f0,&local_1448,0x26,CHECK,CHECK_BUILT_ASSERTION,0);
  ppuVar5 = &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  boost::detail::shared_count::~shared_count((shared_count *)ppuVar5);
  local_1458.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_1468.m_begin = "";
  local_1458.m_end = "";
  local_1468.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)ppuVar5,&local_1458,0x27,&local_1468);
  local_1640._0_4_ = picnic_get_private_key_param(&private_key);
  local_1640.m_message.px = (element_type *)param;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<picnic_params_t>,_const_picnic_params_t_&,_boost::test_tools::assertion::op::EQ<picnic_params_t,_picnic_params_t,_void>_>
  ::evaluate((assertion_result *)&sig,
             (binary_expr<boost::test_tools::assertion::value_expr<picnic_params_t>,_const_picnic_params_t_&,_boost::test_tools::assertion::op::EQ<picnic_params_t,_picnic_params_t,_void>_>
              *)&local_1640,false);
  local_1628.m_lhs.m_value = (unsigned_long *)0x15b716;
  local_15f0.m_empty = false;
  local_1478.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_1478.m_end = "";
  local_1628.m_rhs = (unsigned_long *)0x15b749;
  local_15f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001827d0;
  local_15e0 = boost::unit_test::lazy_ostream::inst;
  local_15d8 = &local_1628;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sig,&local_15f0,&local_1478,0x27,CHECK,CHECK_BUILT_ASSERTION,0);
  ppuVar5 = &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  boost::detail::shared_count::~shared_count((shared_count *)ppuVar5);
  local_1488.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_1498.m_begin = "";
  local_1488.m_end = "";
  local_1498.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)ppuVar5,&local_1488,0x28,&local_1498);
  iVar2 = picnic_validate_keypair(&private_key,&public_key);
  local_1628.m_lhs.m_value._0_1_ = iVar2 == 0;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)&sig,(value_expr<bool> *)&local_1628,false);
  local_1640._0_8_ = "!picnic_validate_keypair(&private_key, &public_key)";
  local_15f0.m_empty = false;
  local_1640.m_message.px = (element_type *)0x15b77d;
  local_15f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001827d0;
  local_15e0 = boost::unit_test::lazy_ostream::inst;
  local_14a8.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_14a8.m_end = "";
  local_15d8 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
                *)&local_1640;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sig,&local_15f0,&local_14a8,0x28,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_02 = &sig;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_02,max_signature_size);
  local_14b8.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_14b8.m_end = "";
  local_14c8.m_begin = "";
  local_14c8.m_end = "";
  siglen = max_signature_size;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_02,&local_14b8,0x2f,&local_14c8);
  iVar2 = picnic_sign(&private_key,&m,0x20,
                      sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,&siglen);
  local_1608 = (char *)CONCAT71(local_1608._1_7_,iVar2 == 0);
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_1640,(value_expr<bool> *)&local_1608,false);
  local_1628.m_lhs.m_value = (unsigned_long *)0x15b77e;
  local_15f0.m_empty = false;
  local_1628.m_rhs = (unsigned_long *)0x15b7c1;
  local_15f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001827d0;
  local_15e0 = boost::unit_test::lazy_ostream::inst;
  local_14d8.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_14d8.m_end = "";
  local_15d8 = &local_1628;
  boost::test_tools::tt_detail::report_assertion
            (&local_1640,&local_15f0,&local_14d8,0x2f,CHECK,CHECK_BUILT_ASSERTION,0);
  psVar6 = &local_1640.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar6);
  local_14e8.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_14f8.m_begin = "";
  local_14e8.m_end = "";
  local_14f8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar6,&local_14e8,0x30,&local_14f8);
  local_1628.m_rhs = (unsigned_long *)((ulong)local_1628.m_rhs & 0xffffffff00000000);
  local_1628.m_lhs.m_value = &siglen;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
  ::evaluate(&local_1640,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
              *)&local_1628,false);
  local_1608 = "siglen > 0";
  local_15f0.m_empty = false;
  local_1508.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_1508.m_end = "";
  local_1600 = "";
  local_15f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001827d0;
  local_15e0 = boost::unit_test::lazy_ostream::inst;
  local_15d8 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
                *)&local_1608;
  boost::test_tools::tt_detail::report_assertion
            (&local_1640,&local_15f0,&local_1508,0x30,CHECK,CHECK_BUILT_ASSERTION,0);
  psVar6 = &local_1640.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar6);
  local_1518.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_1528.m_begin = "";
  local_1518.m_end = "";
  local_1528.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar6,&local_1518,0x31,&local_1528);
  local_1628.m_rhs = &max_signature_size;
  local_1628.m_lhs.m_value = &siglen;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_1640,&local_1628,false);
  local_1608 = "siglen <= max_signature_size";
  local_15f0.m_empty = false;
  local_1600 = "";
  local_15f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001827d0;
  local_15e0 = boost::unit_test::lazy_ostream::inst;
  local_1538.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_1538.m_end = "";
  local_15d8 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
                *)&local_1608;
  boost::test_tools::tt_detail::report_assertion
            (&local_1640,&local_15f0,&local_1538,0x31,CHECK,CHECK_BUILT_ASSERTION,0);
  psVar6 = &local_1640.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar6);
  local_1548.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_1558.m_begin = "";
  local_1548.m_end = "";
  local_1558.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar6,&local_1548,0x33,&local_1558);
  iVar2 = picnic_verify(&public_key,&m,0x20,
                        sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,siglen);
  local_1608 = (char *)CONCAT71(local_1608._1_7_,iVar2 == 0);
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_1640,(value_expr<bool> *)&local_1608,false);
  local_1628.m_lhs.m_value = (unsigned_long *)0x15b7ea;
  local_15f0.m_empty = false;
  local_1628.m_rhs = (unsigned_long *)0x15b82d;
  local_15f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001827d0;
  local_15e0 = boost::unit_test::lazy_ostream::inst;
  local_1568.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_1568.m_end = "";
  local_15d8 = &local_1628;
  boost::test_tools::tt_detail::report_assertion
            (&local_1640,&local_15f0,&local_1568,0x33,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_1640.m_message.pn);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  boost::test_tools::tt_detail::context_frame::~context_frame(&context_frame_250);
  return;
}

Assistant:

BOOST_DATA_TEST_CASE(sign_verify, all_supported_parameters(), param) {
  BOOST_TEST_CONTEXT("Parameter set: " << picnic_get_param_name(param)) {
    const size_t max_signature_size = picnic_signature_size(param);
    BOOST_TEST(max_signature_size);

    std::array<uint8_t, 32> m;
    randomize_container(m);

    // Create a key pair
    picnic_privatekey_t private_key;
    picnic_publickey_t public_key;
    BOOST_TEST(!picnic_keygen(param, &public_key, &private_key));

    // Valid key pair
    BOOST_TEST(picnic_get_public_key_param(&public_key) == param);
    BOOST_TEST(picnic_get_private_key_param(&private_key) == param);
    BOOST_TEST(!picnic_validate_keypair(&private_key, &public_key));

    std::vector<uint8_t> sig;
    sig.resize(max_signature_size);
    size_t siglen = max_signature_size;

    // Sign a message
    BOOST_TEST(!picnic_sign(&private_key, m.data(), m.size(), sig.data(), &siglen));
    BOOST_TEST(siglen > 0);
    BOOST_TEST(siglen <= max_signature_size);
    // Verify signature
    BOOST_TEST(!picnic_verify(&public_key, m.data(), m.size(), sig.data(), siglen));
  }
}